

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

HelicsCore helicsCreateCore(char *type,char *name,char *initString,HelicsError *err)

{
  CoreType type_00;
  core *this;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *extraout_RDX;
  _Alloc_hider _Var4;
  string_view type_01;
  string_view newError;
  string_view coreName;
  string_view configureString;
  string_view configureString_00;
  __single_object core;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_60;
  MasterObjectHolder *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (type == (char *)0x0) {
      type_00 = DEFAULT;
    }
    else {
      this = (core *)strlen(type);
      type_01._M_str = extraout_RDX;
      type_01._M_len = (size_t)type;
      type_00 = helics::core::coreTypeFromString(this,type_01);
      if (type_00 == UNRECOGNIZED) {
        if (err != (HelicsError *)0x0) {
          err->error_code = -4;
          getMasterHolder();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_48,"core type ",&local_a1);
          std::operator+(&local_80,&local_48,type);
          std::operator+(&local_a0,&local_80," is not recognized");
          newError._M_str = local_a0._M_dataplus._M_p;
          newError._M_len = local_a0._M_string_length;
          pcVar1 = MasterObjectHolder::addErrorString(local_58,newError);
          err->message = pcVar1;
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
        }
        goto LAB_00174fce;
      }
    }
    std::make_unique<helics::CoreObject>();
    local_80._M_dataplus._M_p[0x44] = -0x14;
    local_80._M_dataplus._M_p[0x45] = '$';
    local_80._M_dataplus._M_p[0x46] = -0x7c;
    local_80._M_dataplus._M_p[0x47] = '7';
    pcVar1 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      pcVar1 = (char *)strlen(name);
      _Var4._M_p = name;
    }
    if (pcVar1 == (char *)0x0) {
      sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      if (initString != (char *)0x0) {
        sVar3 = strlen(initString);
        _Var4._M_p = initString;
      }
      configureString_00._M_str = _Var4._M_p;
      configureString_00._M_len = sVar3;
      helics::CoreFactory::create((CoreFactory *)&local_a0,type_00,configureString_00);
    }
    else {
      pcVar2 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
      if (initString != (char *)0x0) {
        pcVar2 = (char *)strlen(initString);
      }
      coreName._M_len = (ulong)type_00;
      coreName._M_str = pcVar1;
      configureString._M_str = pcVar2;
      configureString._M_len = (size_t)_Var4._M_p;
      helics::CoreFactory::FindOrCreate((CoreType)&local_a0,coreName,configureString);
    }
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)local_80._M_dataplus._M_p,
               (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
    _Var4._M_p = local_80._M_dataplus._M_p;
    getMasterHolder();
    local_60._M_t.
    super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::CoreObject,_std::default_delete<helics::CoreObject>,_true,_true>)
         (__uniq_ptr_data<helics::CoreObject,_std::default_delete<helics::CoreObject>,_true,_true>)
         local_80._M_dataplus._M_p;
    local_80._M_dataplus._M_p = (pointer)0x0;
    MasterObjectHolder::addCore((MasterObjectHolder *)local_a0._M_dataplus._M_p,&local_60);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              (&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_80
              );
  }
  else {
LAB_00174fce:
    _Var4._M_p = (pointer)0x0;
  }
  return (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p;
}

Assistant:

HelicsCore helicsCreateCore(const char* type, const char* name, const char* initString, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }

    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    try {
        auto core = std::make_unique<helics::CoreObject>();
        core->valid = gCoreValidationIdentifier;
        auto nstring = AS_STRING_VIEW(name);
        if (nstring.empty()) {
            core->coreptr = helics::CoreFactory::create(coretype, AS_STRING_VIEW(initString));
        } else {
            core->coreptr = helics::CoreFactory::FindOrCreate(coretype, nstring, AS_STRING_VIEW(initString));
        }

        auto* retcore = reinterpret_cast<HelicsCore>(core.get());
        getMasterHolder()->addCore(std::move(core));
        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}